

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_morph.cpp
# Opt level: O0

bool __thiscall ON_Localizer::Read(ON_Localizer *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  int iVar2;
  ON_NurbsCurve *this_00;
  ON_NurbsSurface *this_01;
  bool local_3a;
  bool local_39;
  int local_38;
  bool bReadSurface;
  int iStack_34;
  bool bReadCurve;
  int mnv;
  int mjv;
  int i;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_Localizer *this_local;
  
  _minor_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  Destroy(this);
  iStack_24 = 0;
  i = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(_minor_version,0x40008000,&stack0xffffffffffffffdc,&i)
  ;
  if (bVar1) {
    mjv._3_1_ = iStack_24 == 1;
    if ((bool)mjv._3_1_) {
      mnv = 0;
      mjv._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,&mnv);
      if ((bool)mjv._3_1_) {
        switch(mnv) {
        case 1:
          this->m_type = sphere_type;
          break;
        case 2:
          this->m_type = plane_type;
          break;
        case 3:
          this->m_type = cylinder_type;
          break;
        case 4:
          this->m_type = curve_type;
          break;
        case 5:
          this->m_type = surface_type;
          break;
        case 6:
          this->m_type = distance_type;
        }
        mjv._3_1_ = ON_BinaryArchive::ReadPoint(_minor_version,&this->m_P);
        if ((((bool)mjv._3_1_) &&
            (mjv._3_1_ = ON_BinaryArchive::ReadVector(_minor_version,&this->m_V), (bool)mjv._3_1_))
           && (mjv._3_1_ = ON_BinaryArchive::ReadInterval(_minor_version,&this->m_d),
              (bool)mjv._3_1_)) {
          iStack_34 = 0;
          local_38 = 0;
          mjv._3_1_ = ON_BinaryArchive::BeginRead3dmChunk
                                (_minor_version,0x40008000,&stack0xffffffffffffffcc,&local_38);
          if ((bool)mjv._3_1_) {
            mjv._3_1_ = iStack_34 == 1;
            local_39 = false;
            if ((bool)mjv._3_1_) {
              mjv._3_1_ = ON_BinaryArchive::ReadBool(_minor_version,&local_39);
            }
            if (((bool)mjv._3_1_ != false) && ((local_39 & 1U) != 0)) {
              this_00 = (ON_NurbsCurve *)operator_new(0x40);
              ON_NurbsCurve::ON_NurbsCurve(this_00);
              this->m_nurbs_curve = this_00;
              iVar2 = (*(this->m_nurbs_curve->super_ON_Curve).super_ON_Geometry.super_ON_Object.
                        _vptr_ON_Object[0xb])(this->m_nurbs_curve,_minor_version);
              mjv._3_1_ = -(char)iVar2 & 1;
            }
            bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
            if (!bVar1) {
              mjv._3_1_ = 0;
            }
            if (((mjv._3_1_ & 1) != 0) &&
               (mjv._3_1_ = ON_BinaryArchive::BeginRead3dmChunk
                                      (_minor_version,0x40008000,&stack0xffffffffffffffcc,&local_38)
               , (bool)mjv._3_1_)) {
              mjv._3_1_ = iStack_34 == 1;
              local_3a = false;
              mjv._3_1_ = ON_BinaryArchive::ReadBool(_minor_version,&local_3a);
              if (((bool)mjv._3_1_) && ((local_3a & 1U) != 0)) {
                this_01 = (ON_NurbsSurface *)operator_new(0x58);
                ON_NurbsSurface::ON_NurbsSurface(this_01);
                this->m_nurbs_surface = this_01;
                iVar2 = (*(this->m_nurbs_surface->super_ON_Surface).super_ON_Geometry.
                          super_ON_Object._vptr_ON_Object[0xb])
                                  (this->m_nurbs_surface,_minor_version);
                mjv._3_1_ = -(char)iVar2 & 1;
              }
              bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
              if (!bVar1) {
                mjv._3_1_ = 0;
              }
            }
          }
        }
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      mjv._3_1_ = 0;
    }
    this_local._7_1_ = (bool)(mjv._3_1_ & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Localizer::Read(ON_BinaryArchive& archive)
{
  Destroy();

  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;

  for(;;)
  {
    rc = (1 == major_version);
    if ( !rc ) break;

    int i = no_type;
    rc = archive.ReadInt(&i);
    if ( !rc ) break;

    switch(i)
    {
    case sphere_type:   m_type = sphere_type;   break;
    case plane_type:    m_type = plane_type;    break;
    case cylinder_type: m_type = cylinder_type; break;
    case curve_type:    m_type = curve_type;    break;
    case surface_type:  m_type = surface_type;  break;
    case distance_type: m_type = distance_type; break;
    }

    rc = archive.ReadPoint(m_P);
    if ( !rc ) break;
    rc = archive.ReadVector(m_V);
    if ( !rc ) break;
    rc = archive.ReadInterval(m_d);
    if ( !rc ) break;

    int mjv = 0, mnv = 0;
    rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&mjv,&mnv);
    if (!rc) break;
    rc = (1 == mjv);
    bool bReadCurve = false;
    if (rc)
      rc = archive.ReadBool( &bReadCurve );
    if ( rc && bReadCurve)
    {
      m_nurbs_curve = new ON_NurbsCurve();
      rc = m_nurbs_curve->Read(archive)?true:false;
    }
    if ( !archive.EndRead3dmChunk() )
      rc = false;
    if (!rc) break;

    rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&mjv,&mnv);
    if (!rc) break;
    rc = (1 == mjv);
    bool bReadSurface = false;
    rc = archive.ReadBool( &bReadSurface );
    if ( rc && bReadSurface )
    {
      m_nurbs_surface = new ON_NurbsSurface();
      rc = m_nurbs_surface->Read(archive)?true:false;
    }
    if ( !archive.EndRead3dmChunk() )
      rc = false;
    if (!rc) break;

    break;
  }
  
  if ( !archive.EndRead3dmChunk() )
    rc = false;

  return rc;
}